

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O3

int SetTask(void)

{
  pointer pcVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  time_t tVar5;
  long *plVar6;
  long lVar7;
  string word;
  string input;
  string local_60;
  string local_40;
  
  tVar3 = time((time_t *)0x0);
  pcVar1 = currentArray_abi_cxx11_[tVar3 % 100]._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,
             pcVar1 + currentArray_abi_cxx11_[tVar3 % 100]._M_string_length);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_1e96 + 0xf,0x16);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_40);
  iVar2 = WriteCheck(&local_60,&local_40);
  if (iVar2 == 0) {
    time((time_t *)0x0);
    tVar5 = time((time_t *)0x0);
    lVar7 = levelTime - (tVar5 - tVar3);
    if (0 < (int)lVar7 && (lVar7 != 0 && tVar5 - tVar3 <= levelTime)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1ed8,0xe);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      tVar5 = time((time_t *)0x0);
      iVar2 = (int)levelTime - (int)(tVar5 - tVar3);
      if (levelTime <= tVar5 - tVar3) {
        iVar2 = 0;
      }
      Points = Points + iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1eee,0xb);
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,Points);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      goto LAB_00102f6b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1ef8,0x1d);
  }
  iVar2 = WriteCheck(&local_60,&local_40);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1f0e,0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1f24,0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    Flag = 0;
  }
LAB_00102f6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int SetTask()
{

    time_t start = time(NULL);
    // cout << start << endl;
    string word = currentArray[start % 100];
    string input;
    cout << "Пиши слово : " << word << endl;
    cin >> input;
    if (WriteCheck(word, input) == 0) {
        TimerCheck(start);
        if (TimerCheck(start) > 0) {
            cout << "Молодец" << endl;
            Points += TimerCheck(start);
            cout << "Очков=" << Points << endl;
            return 0;
        } else {
            cout << "Не влез во время";
        }
    }
    if (WriteCheck(word, input) == 1) {
        cout << "Не верно,ты опечатался\n";
        cout << "Ты проиграл" << endl;
        Flag = 0;
        return 0;
    } else
        ;

    return 0;
}